

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::PrintValue<std::array<bfy_iovec,1ul>,void>
               (array<bfy_iovec,_1UL> *container,ostream *os)

{
  array<bfy_iovec,_1UL> *__range3;
  char local_1c [4];
  
  local_1c[0] = '{';
  std::__ostream_insert<char,std::char_traits<char>>(os,local_1c,1);
  local_1c[1] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_1c + 1,1);
  ::operator<<(os,container->_M_elems);
  local_1c[2] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_1c + 2,1);
  local_1c[3] = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_1c + 3,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }